

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>_>
* __thiscall
llvm::
SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>_>
::operator=(SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>_>
            *this,SmallVectorImpl<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>_>
                  *RHS)

{
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
  *__first;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
  *pIVar1;
  ulong uVar2;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
  *E;
  ulong uVar3;
  InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
  *__result;
  
  if (this == RHS) {
    return this;
  }
  __first = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
             *)(RHS->
               super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
               ).
               super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
               .super_SmallVectorBase.BeginX;
  pIVar1 = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
            *)(RHS->
              super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
              ).
              super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
              .super_SmallVectorBase.EndX;
  uVar3 = (long)pIVar1 - (long)__first;
  __result = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
              *)(this->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
                .super_SmallVectorBase.BeginX;
  E = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
       *)(this->
         super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
         .super_SmallVectorBase.EndX;
  uVar2 = ((long)E - (long)__result) / 0x178;
  if ((ulong)((long)uVar3 / 0x178) <= uVar2) {
    if (pIVar1 != __first) {
      __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
                 __copy_m<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<299u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<299u,Fixpp::Type::String>>>*>
                           (__first,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
                                     *)(uVar3 + (long)__first),__result);
      E = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
           *)(this->
             super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
             ).
             super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
             .super_SmallVectorBase.EndX;
    }
    SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
    ::destroy_range(__result,E);
    goto LAB_00aec05c;
  }
  if ((ulong)((long)(this->
                    super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
                    ).
                    super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
                    .super_SmallVectorBase.CapacityX - (long)__result) < uVar3) {
    SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
    ::destroy_range(__result,E);
    (this->
    super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
    ).
    super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
    .super_SmallVectorBase.EndX =
         (this->
         super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
         ).
         super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
         .super_SmallVectorBase.BeginX;
    SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
    ::grow(&this->
            super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
           ,(long)uVar3 / 0x178);
LAB_00aec03d:
    uVar2 = 0;
  }
  else {
    if (E == __result) goto LAB_00aec03d;
    std::__copy_move<false,false,std::random_access_iterator_tag>::
    __copy_m<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<299u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<299u,Fixpp::Type::String>>>*>
              (__first,(InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
                        *)(((long)E - (long)__result) + (long)__first),__result);
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<299u,Fixpp::Type::String>>>const*,Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<269u,Fixpp::Type::Char>,Fixpp::TagT<270u,Fixpp::Type::Float>,Fixpp::TagT<271u,Fixpp::Type::Float>,Fixpp::TagT<346u,Fixpp::Type::Int>,Fixpp::TagT<272u,Fixpp::Type::UTCDate>,Fixpp::TagT<299u,Fixpp::Type::String>>>*>
            ((InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
              *)((long)(RHS->
                       super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
                       ).
                       super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
                       .super_SmallVectorBase.BeginX + uVar2 * 0x178),
             (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
              *)(RHS->
                super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
                ).
                super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
                .super_SmallVectorBase.EndX,
             (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
              *)(uVar2 * 0x178 +
                (long)(this->
                      super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
                      ).
                      super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
                      .super_SmallVectorBase.BeginX));
  __result = (InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>
              *)(uVar3 + (long)(this->
                               super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
                               ).
                               super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
                               .super_SmallVectorBase.BeginX);
LAB_00aec05c:
  (this->
  super_SmallVectorTemplateBase<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_false>
  ).
  super_SmallVectorTemplateCommon<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<268U,_Fixpp::Type::Int>,_Fixpp::SizeHint<10UL>,_Fixpp::TagT<269U,_Fixpp::Type::Char>,_Fixpp::TagT<270U,_Fixpp::Type::Float>,_Fixpp::TagT<271U,_Fixpp::Type::Float>,_Fixpp::TagT<346U,_Fixpp::Type::Int>,_Fixpp::TagT<272U,_Fixpp::Type::UTCDate>,_Fixpp::TagT<299U,_Fixpp::Type::String>_>_>,_void>
  .super_SmallVectorBase.EndX = __result;
  return this;
}

Assistant:

SmallVectorImpl<T> &SmallVectorImpl<T>::
  operator=(const SmallVectorImpl<T> &RHS) {
  // Avoid self-assignment.
  if (this == &RHS) return *this;

  // If we already have sufficient space, assign the common elements, then
  // destroy any excess.
  size_t RHSSize = RHS.size();
  size_t CurSize = this->size();
  if (CurSize >= RHSSize) {
    // Assign common elements.
    iterator NewEnd;
    if (RHSSize)
      NewEnd = std::copy(RHS.begin(), RHS.begin()+RHSSize, this->begin());
    else
      NewEnd = this->begin();

    // Destroy excess elements.
    this->destroy_range(NewEnd, this->end());

    // Trim.
    this->setEnd(NewEnd);
    return *this;
  }

  // If we have to grow to have enough elements, destroy the current elements.
  // This allows us to avoid copying them during the grow.
  // FIXME: don't do this if they're efficiently moveable.
  if (this->capacity() < RHSSize) {
    // Destroy current elements.
    this->destroy_range(this->begin(), this->end());
    this->setEnd(this->begin());
    CurSize = 0;
    this->grow(RHSSize);
  } else if (CurSize) {
    // Otherwise, use assignment for the already-constructed elements.
    std::copy(RHS.begin(), RHS.begin()+CurSize, this->begin());
  }

  // Copy construct the new elements in place.
  this->uninitialized_copy(RHS.begin()+CurSize, RHS.end(),
                           this->begin()+CurSize);

  // Set end.
  this->setEnd(this->begin()+RHSSize);
  return *this;
}